

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_spatializer_init_preallocated
                    (ma_spatializer_config *pConfig,void *pHeap,ma_spatializer *pSpatializer)

{
  ma_handedness mVar1;
  ulong uVar2;
  ma_channel *pIn;
  ma_positioning mVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ma_result mVar7;
  ma_spatializer_heap_layout heapLayout;
  ma_gainer_config gainerConfig;
  
  mVar7 = MA_INVALID_ARGS;
  if (pSpatializer != (ma_spatializer *)0x0) {
    memset(pSpatializer,0,0xb8);
    if (pHeap != (void *)0x0 && pConfig != (ma_spatializer_config *)0x0) {
      mVar7 = ma_spatializer_get_heap_layout(pConfig,&heapLayout);
      if (mVar7 == MA_SUCCESS) {
        pSpatializer->_pHeap = pHeap;
        if (heapLayout.sizeInBytes != 0) {
          memset(pHeap,0,heapLayout.sizeInBytes);
        }
        uVar2._0_4_ = pConfig->channelsIn;
        uVar2._4_4_ = pConfig->channelsOut;
        pSpatializer->channelsIn = (undefined4)uVar2;
        pSpatializer->channelsOut = uVar2._4_4_;
        mVar3 = pConfig->positioning;
        pSpatializer->attenuationModel = pConfig->attenuationModel;
        pSpatializer->positioning = mVar3;
        mVar1 = pConfig->handedness;
        pSpatializer->handedness = mVar1;
        fVar4 = pConfig->maxGain;
        fVar5 = pConfig->minDistance;
        fVar6 = pConfig->maxDistance;
        pSpatializer->minGain = pConfig->minGain;
        pSpatializer->maxGain = fVar4;
        pSpatializer->minDistance = fVar5;
        pSpatializer->maxDistance = fVar6;
        fVar4 = pConfig->coneInnerAngleInRadians;
        fVar5 = pConfig->coneOuterAngleInRadians;
        fVar6 = pConfig->coneOuterGain;
        pSpatializer->rolloff = pConfig->rolloff;
        pSpatializer->coneInnerAngleInRadians = fVar4;
        pSpatializer->coneOuterAngleInRadians = fVar5;
        pSpatializer->coneOuterGain = fVar6;
        fVar4 = pConfig->directionalAttenuationFactor;
        pSpatializer->dopplerFactor = pConfig->dopplerFactor;
        pSpatializer->directionalAttenuationFactor = fVar4;
        pSpatializer->gainSmoothTimeInFrames = pConfig->gainSmoothTimeInFrames;
        (pSpatializer->position).x = 0.0;
        (pSpatializer->position).y = 0.0;
        *(undefined8 *)&(pSpatializer->position).z = 0;
        (pSpatializer->direction).y = 0.0;
        (pSpatializer->direction).z = -1.0;
        (pSpatializer->velocity).x = 0.0;
        (pSpatializer->velocity).y = 0.0;
        *(undefined8 *)&(pSpatializer->velocity).z = 0x3f80000000000000;
        if (mVar1 == ma_handedness_left) {
          (pSpatializer->direction).x = -0.0;
          (pSpatializer->direction).y = -0.0;
          (pSpatializer->direction).z = 1.0;
        }
        pIn = pConfig->pChannelMapIn;
        if (pIn != (ma_channel *)0x0) {
          pSpatializer->pChannelMapIn = (ma_channel *)(heapLayout.channelMapInOffset + (long)pHeap);
          ma_channel_map_copy_or_default
                    ((ma_channel *)(heapLayout.channelMapInOffset + (long)pHeap),uVar2 & 0xffffffff,
                     pIn,(undefined4)uVar2);
        }
        pSpatializer->pNewChannelGainsOut =
             (float *)(heapLayout.newChannelGainsOffset + (long)pHeap);
        gainerConfig.smoothTimeInFrames = pConfig->gainSmoothTimeInFrames;
        gainerConfig.channels = pConfig->channelsOut;
        mVar7 = ma_gainer_init_preallocated
                          (&gainerConfig,(void *)((long)pHeap + heapLayout.gainerOffset),
                           &pSpatializer->gainer);
      }
    }
  }
  return mVar7;
}

Assistant:

MA_API ma_result ma_spatializer_init_preallocated(const ma_spatializer_config* pConfig, void* pHeap, ma_spatializer* pSpatializer)
{
    ma_result result;
    ma_spatializer_heap_layout heapLayout;
    ma_gainer_config gainerConfig;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pSpatializer);

    if (pConfig == NULL || pHeap == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_spatializer_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pSpatializer->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pSpatializer->channelsIn                   = pConfig->channelsIn;
    pSpatializer->channelsOut                  = pConfig->channelsOut;
    pSpatializer->attenuationModel             = pConfig->attenuationModel;
    pSpatializer->positioning                  = pConfig->positioning;
    pSpatializer->handedness                   = pConfig->handedness;
    pSpatializer->minGain                      = pConfig->minGain;
    pSpatializer->maxGain                      = pConfig->maxGain;
    pSpatializer->minDistance                  = pConfig->minDistance;
    pSpatializer->maxDistance                  = pConfig->maxDistance;
    pSpatializer->rolloff                      = pConfig->rolloff;
    pSpatializer->coneInnerAngleInRadians      = pConfig->coneInnerAngleInRadians;
    pSpatializer->coneOuterAngleInRadians      = pConfig->coneOuterAngleInRadians;
    pSpatializer->coneOuterGain                = pConfig->coneOuterGain;
    pSpatializer->dopplerFactor                = pConfig->dopplerFactor;
    pSpatializer->directionalAttenuationFactor = pConfig->directionalAttenuationFactor;
    pSpatializer->gainSmoothTimeInFrames       = pConfig->gainSmoothTimeInFrames;
    pSpatializer->position                     = ma_vec3f_init_3f(0, 0,  0);
    pSpatializer->direction                    = ma_vec3f_init_3f(0, 0, -1);
    pSpatializer->velocity                     = ma_vec3f_init_3f(0, 0,  0);
    pSpatializer->dopplerPitch                 = 1;

    /* Swap the forward direction if we're left handed (it was initialized based on right handed). */
    if (pSpatializer->handedness == ma_handedness_left) {
        pSpatializer->direction = ma_vec3f_neg(pSpatializer->direction);
    }

    /* Channel map. This will be on the heap. */
    if (pConfig->pChannelMapIn != NULL) {
        pSpatializer->pChannelMapIn = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapInOffset);
        ma_channel_map_copy_or_default(pSpatializer->pChannelMapIn, pSpatializer->channelsIn, pConfig->pChannelMapIn, pSpatializer->channelsIn);
    }

    /* New channel gains for output channels. */
    pSpatializer->pNewChannelGainsOut = (float*)ma_offset_ptr(pHeap, heapLayout.newChannelGainsOffset);

    /* Gainer. */
    gainerConfig = ma_spatializer_gainer_config_init(pConfig);

    result = ma_gainer_init_preallocated(&gainerConfig, ma_offset_ptr(pHeap, heapLayout.gainerOffset), &pSpatializer->gainer);
    if (result != MA_SUCCESS) {
        return result;  /* Failed to initialize the gainer. */
    }

    return MA_SUCCESS;
}